

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O3

PerThreadSynch * absl::Enqueue(PerThreadSynch *head,SynchWaitParams *waitp,intptr_t mu,int flags)

{
  int iVar1;
  atomic<long> *paVar2;
  ulong uVar3;
  PerThreadSynch *pPVar4;
  PerThreadSynch *pPVar5;
  int in_EAX;
  uint uVar6;
  PerThreadSynch *pPVar7;
  long lVar8;
  pthread_t __target_thread;
  PerThreadSynch *pPVar9;
  PerThreadSynch *pPVar10;
  intptr_t extraout_RDX;
  synchronization_internal *this;
  PerThreadSynch *x;
  bool bVar11;
  double dVar12;
  sched_param param;
  int policy;
  sched_param local_38;
  int local_34;
  
  paVar2 = waitp->cv_word;
  if (paVar2 != (atomic<long> *)0x0) {
    waitp->cv_word = (atomic<long> *)0x0;
    this = (synchronization_internal *)0x0;
    do {
      uVar3 = (paVar2->super___atomic_base<long>)._M_i;
      if ((uVar3 & 1) == 0) {
        LOCK();
        bVar11 = uVar3 == (paVar2->super___atomic_base<long>)._M_i;
        if (bVar11) {
          (paVar2->super___atomic_base<long>)._M_i = uVar3 | 1;
        }
        UNLOCK();
        if (bVar11) {
          pPVar7 = waitp->thread;
          if (pPVar7->waitp != (SynchWaitParams *)0x0) {
            raw_logging_internal::RawLog
                      (kFatal,"mutex.cc",0x9e9,"Check %s failed: %s",
                       "waitp->thread->waitp == nullptr","waiting when shouldn\'t be");
            pPVar7 = waitp->thread;
          }
          pPVar7->waitp = waitp;
          pPVar9 = (PerThreadSynch *)(uVar3 & 0xfffffffffffffffc);
          pPVar10 = pPVar7;
          if (pPVar9 != (PerThreadSynch *)0x0) {
            pPVar7->next = pPVar9->next;
            pPVar10 = pPVar9;
          }
          pPVar10->next = pPVar7;
          (pPVar7->state)._M_i = kQueued;
          (paVar2->super___atomic_base<long>)._M_i = (ulong)((uint)uVar3 & 2) | (ulong)waitp->thread
          ;
          return head;
        }
      }
      uVar6 = synchronization_internal::MutexDelay(this,1,(int)mu);
      this = (synchronization_internal *)(ulong)uVar6;
      mu = extraout_RDX;
    } while( true );
  }
  pPVar7 = waitp->thread;
  local_38.__sched_priority = in_EAX;
  if ((pPVar7->waitp != waitp && pPVar7->waitp != (SynchWaitParams *)0x0) &&
     (pPVar7->suppress_fatal_errors == false)) {
    Enqueue();
  }
  pPVar7->waitp = waitp;
  pPVar7->skip = (PerThreadSynch *)0x0;
  pPVar7->may_skip = true;
  pPVar7->wake = false;
  pPVar7->cond_waiter = (bool)((byte)flags >> 1 & 1);
  pPVar10 = pPVar7;
  if (head == (PerThreadSynch *)0x0) {
    pPVar7->next = pPVar7;
    pPVar7->readers = mu;
    pPVar7->maybe_unlocking = false;
    goto LAB_0014a3c8;
  }
  if (base_internal::CycleClock::cycle_clock_source_ == (code *)0x0) {
    lVar8 = rdtsc();
  }
  else {
    lVar8 = (*base_internal::CycleClock::cycle_clock_source_)();
  }
  if (pPVar7->next_priority_read_cycles < lVar8 >> 2) {
    __target_thread = pthread_self();
    uVar6 = pthread_getschedparam(__target_thread,&local_34,&local_38);
    if (uVar6 == 0) {
      pPVar7->priority = local_38.__sched_priority;
      dVar12 = base_internal::UnscaledCycleClock::Frequency();
      pPVar7->next_priority_read_cycles = (lVar8 >> 2) + (long)(dVar12 * 0.25);
    }
    else {
      raw_logging_internal::RawLog
                (kError,"mutex.cc",0x39e,"pthread_getschedparam failed: %d",(ulong)uVar6);
    }
  }
  iVar1 = pPVar7->priority;
  bVar11 = head->maybe_unlocking;
  if (head->priority < iVar1) {
    pPVar9 = head;
    if ((bVar11 & 1U) == 0) {
      do {
        x = pPVar9;
        pPVar10 = x->next;
        pPVar4 = pPVar10->skip;
        pPVar9 = pPVar10;
        if (pPVar4 != (PerThreadSynch *)0x0) {
          pPVar5 = pPVar10;
          pPVar9 = pPVar4;
          for (pPVar4 = pPVar4->skip; pPVar4 != (PerThreadSynch *)0x0; pPVar4 = pPVar4->skip) {
            pPVar5->skip = pPVar4;
            pPVar5 = pPVar9;
            pPVar9 = pPVar4;
          }
          pPVar10->skip = pPVar9;
        }
      } while (iVar1 <= pPVar9->priority);
    }
    else if ((waitp->how != (MuHow)kExclusiveS) ||
            ((x = head, waitp->cond != (Condition *)0x0 &&
             (waitp->cond->eval_ != (_func_bool_Condition_ptr *)0x0)))) goto LAB_0014a2e6;
    pPVar7->next = x->next;
    x->next = pPVar7;
    if ((x->skip != (PerThreadSynch *)0x0) && (bVar11 = MuEquivalentWaiter(x,pPVar7), !bVar11)) {
      Enqueue();
    }
    if ((x != head) && (x->may_skip == true)) {
      pPVar10 = x->next;
      bVar11 = MuEquivalentWaiter(x,pPVar10);
      if (bVar11) {
        x->skip = pPVar10;
      }
    }
    pPVar9 = pPVar7->next;
    bVar11 = MuEquivalentWaiter(pPVar7,pPVar9);
    pPVar10 = head;
    if (bVar11) {
      pPVar7->skip = pPVar9;
    }
  }
  else {
LAB_0014a2e6:
    pPVar7->next = head->next;
    head->next = pPVar7;
    pPVar7->readers = head->readers;
    pPVar7->maybe_unlocking = bVar11;
    if ((head->may_skip == true) && (bVar11 = MuEquivalentWaiter(head,pPVar7), bVar11)) {
      head->skip = pPVar7;
    }
  }
LAB_0014a3c8:
  (pPVar7->state)._M_i = kQueued;
  return pPVar10;
}

Assistant:

static PerThreadSynch *Enqueue(PerThreadSynch *head,
                               SynchWaitParams *waitp, intptr_t mu, int flags) {
  // If we have been given a cv_word, call CondVarEnqueue() and return
  // the previous head of the Mutex waiter queue.
  if (waitp->cv_word != nullptr) {
    CondVarEnqueue(waitp);
    return head;
  }

  PerThreadSynch *s = waitp->thread;
  ABSL_RAW_CHECK(
      s->waitp == nullptr ||    // normal case
          s->waitp == waitp ||  // Fer()---transfer from condition variable
          s->suppress_fatal_errors,
      "detected illegal recursion into Mutex code");
  s->waitp = waitp;
  s->skip = nullptr;             // maintain skip invariant (see above)
  s->may_skip = true;            // always true on entering queue
  s->wake = false;               // not being woken
  s->cond_waiter = ((flags & kMuIsCond) != 0);
  if (head == nullptr) {         // s is the only waiter
    s->next = s;                 // it's the only entry in the cycle
    s->readers = mu;             // reader count is from mu word
    s->maybe_unlocking = false;  // no one is searching an empty list
    head = s;                    // s is new head
  } else {
    PerThreadSynch *enqueue_after = nullptr;  // we'll put s after this element
#ifdef ABSL_HAVE_PTHREAD_GETSCHEDPARAM
    int64_t now_cycles = base_internal::CycleClock::Now();
    if (s->next_priority_read_cycles < now_cycles) {
      // Every so often, update our idea of the thread's priority.
      // pthread_getschedparam() is 5% of the block/wakeup time;
      // base_internal::CycleClock::Now() is 0.5%.
      int policy;
      struct sched_param param;
      const int err = pthread_getschedparam(pthread_self(), &policy, &param);
      if (err != 0) {
        ABSL_RAW_LOG(ERROR, "pthread_getschedparam failed: %d", err);
      } else {
        s->priority = param.sched_priority;
        s->next_priority_read_cycles =
            now_cycles +
            static_cast<int64_t>(base_internal::CycleClock::Frequency());
      }
    }
    if (s->priority > head->priority) {  // s's priority is above head's
      // try to put s in priority-fifo order, or failing that at the front.
      if (!head->maybe_unlocking) {
        // No unlocker can be scanning the queue, so we can insert into the
        // middle of the queue.
        //
        // Within a skip chain, all waiters have the same priority, so we can
        // skip forward through the chains until we find one with a lower
        // priority than the waiter to be enqueued.
        PerThreadSynch *advance_to = head;    // next value of enqueue_after
        do {
          enqueue_after = advance_to;
          // (side-effect: optimizes skip chain)
          advance_to = Skip(enqueue_after->next);
        } while (s->priority <= advance_to->priority);
              // termination guaranteed because s->priority > head->priority
              // and head is the end of a skip chain
      } else if (waitp->how == kExclusive &&
                 Condition::GuaranteedEqual(waitp->cond, nullptr)) {
        // An unlocker could be scanning the queue, but we know it will recheck
        // the queue front for writers that have no condition, which is what s
        // is, so an insert at front is safe.
        enqueue_after = head;       // add after head, at front
      }
    }
#endif
    if (enqueue_after != nullptr) {
      s->next = enqueue_after->next;
      enqueue_after->next = s;

      // enqueue_after can be: head, Skip(...), or cur.
      // The first two imply enqueue_after->skip == nullptr, and
      // the last is used only if MuEquivalentWaiter(s, cur).
      // We require this because clearing enqueue_after->skip
      // is impossible; enqueue_after's predecessors might also
      // incorrectly skip over s if we were to allow other
      // insertion points.
      ABSL_RAW_CHECK(enqueue_after->skip == nullptr ||
                         MuEquivalentWaiter(enqueue_after, s),
                     "Mutex Enqueue failure");

      if (enqueue_after != head && enqueue_after->may_skip &&
          MuEquivalentWaiter(enqueue_after, enqueue_after->next)) {
        // enqueue_after can skip to its new successor, s
        enqueue_after->skip = enqueue_after->next;
      }
      if (MuEquivalentWaiter(s, s->next)) {  // s->may_skip is known to be true
        s->skip = s->next;                // s may skip to its successor
      }
    } else {   // enqueue not done any other way, so
               // we're inserting s at the back
      // s will become new head; copy data from head into it
      s->next = head->next;        // add s after head
      head->next = s;
      s->readers = head->readers;  // reader count is from previous head
      s->maybe_unlocking = head->maybe_unlocking;  // same for unlock hint
      if (head->may_skip && MuEquivalentWaiter(head, s)) {
        // head now has successor; may skip
        head->skip = s;
      }
      head = s;  // s is new head
    }
  }
  s->state.store(PerThreadSynch::kQueued, std::memory_order_relaxed);
  return head;
}